

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderHelperInvocationTests.cpp
# Opt level: O1

void deqp::gles31::Functional::anon_unknown_1::drawRandomPrimitives
               (RenderContext *renderCtx,deUint32 program,PrimitiveType primType,int numPrimitives,
               Random *rnd)

{
  uint uVar1;
  bool bVar2;
  pointer pVVar3;
  pointer pVVar4;
  deRandom *pdVar5;
  int iVar6;
  deUint32 dVar7;
  undefined4 uVar8;
  undefined4 extraout_var;
  ulong uVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  int iVar13;
  bool bVar14;
  ulong uVar15;
  bool bVar16;
  uint uVar17;
  float fVar18;
  float fVar19;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> vertices;
  vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> vertexArrays;
  Vec2 range;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> local_148;
  long local_128;
  deRandom *local_120;
  undefined8 local_118;
  undefined8 uStack_110;
  ulong local_100;
  vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> local_f8;
  ulong local_e0;
  RenderContext *local_d8;
  long *local_d0;
  long local_c8;
  long local_c0 [2];
  Type local_b0;
  long *local_a8;
  long local_a0;
  long local_98 [2];
  int local_88;
  undefined1 local_80 [8];
  _Alloc_hider local_78;
  void *local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  int local_58;
  VertexArrayPointer local_50;
  
  uVar15 = (ulong)primType;
  local_120 = &rnd->m_rnd;
  local_d8 = renderCtx;
  iVar6 = (*renderCtx->_vptr_RenderContext[3])();
  local_128 = CONCAT44(extraout_var,iVar6);
  iVar6 = 0;
  local_148.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_148.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8.super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8.super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>.
  _M_impl.super__Vector_impl_data._M_start = (VertexArrayBinding *)0x0;
  local_f8.super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bVar2 = true;
  switch(uVar15) {
  case 0:
    iVar6 = 3;
    break;
  case 1:
  case 2:
    iVar6 = 2;
    break;
  case 3:
  case 4:
    iVar6 = 1;
    break;
  default:
    bVar2 = false;
  }
  local_100 = uVar15;
  local_e0 = uVar15;
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::resize
            (&local_148,(long)(iVar6 * numPrimitives));
  pdVar5 = local_120;
  if (local_148.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_148.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    local_118 = CONCAT44(local_118._4_4_,
                         *(undefined4 *)
                          (&DAT_01cc3690 + (ulong)(primType == PRIMITIVETYPE_TRIANGLE) * 4));
    fVar19 = *(float *)(&DAT_01cc3698 + (ulong)((int)local_100 == 0) * 4);
    uVar15 = 0;
    do {
      fVar18 = deRandom_getFloat(pdVar5);
      local_148.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar15].m_data[0] =
           fVar18 * fVar19 + (float)local_118;
      fVar18 = deRandom_getFloat(pdVar5);
      local_148.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar15].m_data[1] =
           fVar18 * fVar19 + (float)local_118;
      uVar15 = uVar15 + 1;
    } while (uVar15 < (ulong)((long)local_148.
                                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_148.
                                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  if (0 < numPrimitives) {
    iVar10 = 0;
    uVar15 = 0;
    do {
      iVar11 = iVar6 * (int)uVar15;
      lVar12 = 0;
      do {
        if (bVar2) {
          bVar16 = true;
          bVar14 = true;
          uVar9 = (ulong)(iVar6 + (uint)(iVar6 == 0));
          iVar13 = iVar10;
          do {
            if (-0.9 < local_148.
                       super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[iVar13].m_data[lVar12]) {
              bVar14 = false;
            }
            if (local_148.
                super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
                _M_impl.super__Vector_impl_data._M_start[iVar13].m_data[lVar12] < 0.9) {
              bVar16 = false;
            }
            iVar13 = iVar13 + 1;
            uVar9 = uVar9 - 1;
          } while (uVar9 != 0);
          if ((bVar14) || (bVar16)) goto LAB_01668831;
        }
        else {
LAB_01668831:
          fVar19 = local_148.
                   super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar11].m_data[1];
          local_148.
          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl
          .super__Vector_impl_data._M_start[iVar11].m_data[0] =
               -local_148.
                super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
                _M_impl.super__Vector_impl_data._M_start[iVar11].m_data[0];
          local_148.
          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl
          .super__Vector_impl_data._M_start[iVar11].m_data[1] = -fVar19;
        }
        bVar16 = lVar12 == 0;
        lVar12 = lVar12 + 1;
      } while (bVar16);
      uVar15 = uVar15 + 1;
      iVar10 = iVar10 + iVar6;
    } while (uVar15 != (uint)numPrimitives);
  }
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"a_position","");
  pVVar4 = local_148.
           super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pVVar3 = local_148.
           super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_b0 = TYPE_NAME;
  local_a8 = local_98;
  std::__cxx11::string::_M_construct<char*>((string *)&local_a8,local_d0,local_c8 + (long)local_d0);
  local_88 = 0;
  local_80._0_4_ = local_b0;
  local_78._M_p = (pointer)&local_68;
  std::__cxx11::string::_M_construct<char*>((string *)&local_78,local_a8,local_a0 + (long)local_a8);
  local_58 = local_88;
  local_50.componentType = VTX_COMP_FLOAT;
  local_50.convert = VTX_COMP_CONVERT_NONE;
  local_50.numComponents = 2;
  local_50.numElements = (int)((ulong)((long)pVVar4 - (long)pVVar3) >> 3);
  local_50.stride = 0;
  local_50.data = pVVar3;
  if (local_a8 != local_98) {
    operator_delete(local_a8,local_98[0] + 1);
  }
  std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::
  emplace_back<glu::VertexArrayBinding>(&local_f8,(VertexArrayBinding *)local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_p != &local_68) {
    operator_delete(local_78._M_p,local_68._M_allocated_capacity + 1);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0,local_c0[0] + 1);
  }
  (**(code **)(local_128 + 0x1680))(program);
  pdVar5 = local_120;
  lVar12 = local_128;
  uVar1 = (uint)local_100;
  if (uVar1 - 3 < 2) {
    local_80 = (undefined1  [8])0x0;
    (**(code **)(local_128 + 0x818))(0x846d);
    pdVar5 = local_120;
    dVar7 = (**(code **)(lVar12 + 0x800))();
    glu::checkError(dVar7,"glGetFloatv()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderHelperInvocationTests.cpp"
                    ,0x9e);
    if (uVar1 == 4) {
      fVar19 = deRandom_getFloat(pdVar5);
      fVar19 = fVar19 * 16.0 + 16.0;
      uVar17 = -(uint)(fVar19 <= (float)local_80._4_4_);
      local_118 = CONCAT44(extraout_XMM0_Db,~uVar17 & local_80._4_4_ | (uint)fVar19 & uVar17);
      uStack_110 = CONCAT44(extraout_XMM0_Dd,extraout_XMM0_Dc);
    }
    else {
      local_118 = 0x3f800000;
      uStack_110 = 0;
    }
    uVar8 = (**(code **)(lVar12 + 0xb48))(program,"u_pointSize");
    (**(code **)(lVar12 + 0x14e0))((float)local_118,uVar8);
  }
  else if (uVar1 == 2) {
    local_80 = (undefined1  [8])0x0;
    (**(code **)(local_128 + 0x818))(0x846e);
    dVar7 = (**(code **)(lVar12 + 0x800))();
    glu::checkError(dVar7,"glGetFloatv()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderHelperInvocationTests.cpp"
                    ,0x9e);
    fVar19 = deRandom_getFloat(pdVar5);
    fVar19 = fVar19 * 16.0 + 16.0;
    uVar17 = -(uint)(fVar19 <= (float)local_80._4_4_);
    (**(code **)(lVar12 + 0xce0))(~uVar17 & local_80._4_4_ | (uint)fVar19 & uVar17);
  }
  local_80._0_4_ = 8;
  if (uVar1 < 5) {
    local_80._0_4_ = *(undefined4 *)(&DAT_01cc3778 + local_e0 * 4);
  }
  local_80._4_4_ =
       (int)((ulong)((long)local_148.
                           super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_148.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 3);
  local_78._M_p._0_4_ = 3;
  local_70 = (void *)0x0;
  glu::draw(local_d8,program,
            (int)((ulong)((long)local_f8.
                                super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_f8.
                               super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x33333333,
            local_f8.
            super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>.
            _M_impl.super__Vector_impl_data._M_start,(PrimitiveList *)local_80,
            (DrawUtilCallback *)0x0);
  std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::~vector(&local_f8)
  ;
  if (local_148.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_148.
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_148.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_148.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

static void drawRandomPrimitives (const glu::RenderContext& renderCtx, deUint32 program, PrimitiveType primType, int numPrimitives, de::Random* rnd)
{
	const glw::Functions&			gl				= renderCtx.getFunctions();
	const float						minPointSize	= 16.0f;
	const float						maxPointSize	= 32.0f;
	const float						minLineWidth	= 16.0f;
	const float						maxLineWidth	= 32.0f;
	vector<Vec2>					vertices;
	vector<glu::VertexArrayBinding>	vertexArrays;

	genVertices(primType, numPrimitives, rnd, &vertices);

	vertexArrays.push_back(glu::va::Float("a_position", 2, (int)vertices.size(), 0, (const float*)&vertices[0]));

	gl.useProgram(program);

	// Special state for certain primitives
	if (primType == PRIMITIVETYPE_POINT || primType == PRIMITIVETYPE_WIDE_POINT)
	{
		const Vec2		range			= getRange(gl, GL_ALIASED_POINT_SIZE_RANGE);
		const bool		isWidePoint		= primType == PRIMITIVETYPE_WIDE_POINT;
		const float		pointSize		= isWidePoint ? de::min(rnd->getFloat(minPointSize, maxPointSize), range.y()) : 1.0f;
		const int		pointSizeLoc	= gl.getUniformLocation(program, "u_pointSize");

		gl.uniform1f(pointSizeLoc, pointSize);
	}
	else if (primType == PRIMITIVETYPE_WIDE_LINE)
	{
		const Vec2		range			= getRange(gl, GL_ALIASED_LINE_WIDTH_RANGE);
		const float		lineWidth		= de::min(rnd->getFloat(minLineWidth, maxLineWidth), range.y());

		gl.lineWidth(lineWidth);
	}

	glu::draw(renderCtx, program, (int)vertexArrays.size(), &vertexArrays[0],
			  glu::PrimitiveList(getGluPrimitiveType(primType), (int)vertices.size()));
}